

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bucket.cpp
# Opt level: O0

ssize_t __thiscall bucket::read(bucket *this,int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  reference this_00;
  size_t __nbytes_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  uint local_58;
  int i;
  allocator<index> local_41;
  vector<index,_std::allocator<index>_> local_40;
  fpos<__mbstate_t> local_28;
  char *local_18;
  fstream *stream_local;
  bucket *this_local;
  
  local_18 = (char *)CONCAT44(in_register_00000034,__fd);
  stream_local = (fstream *)this;
  std::fpos<__mbstate_t>::fpos(&local_28,0);
  std::istream::seekg((char *)CONCAT44(in_register_00000034,__fd),local_28._M_off,local_28._M_state)
  ;
  std::istream::read(local_18,(long)this);
  std::istream::read(local_18,(long)&this->size);
  std::istream::read(local_18,(long)&this->depth);
  bVar1 = this->size;
  std::allocator<index>::allocator(&local_41);
  std::vector<index,_std::allocator<index>_>::vector(&local_40,(ulong)bVar1,&local_41);
  std::vector<index,_std::allocator<index>_>::operator=(&this->indices,&local_40);
  std::vector<index,_std::allocator<index>_>::~vector(&local_40);
  std::allocator<index>::~allocator(&local_41);
  local_58 = 0;
  while( true ) {
    __nbytes_00 = (size_t)this->size;
    if ((int)(uint)this->size <= (int)local_58) break;
    this_00 = std::vector<index,_std::allocator<index>_>::operator[]
                        (&this->indices,(long)(int)local_58);
    index::read(this_00,(int)local_18,__buf_00,__nbytes_00);
    local_58 = local_58 + 1;
  }
  return (ulong)local_58;
}

Assistant:

void bucket::read(std::fstream &stream) {
    stream.seekg(0);

    stream.read((char *) &id, BUCKET_ID);
    stream.read((char *) &size, BUCKET_SIZE_FIELD);
    stream.read((char *) &depth, DEPTHS);

    indices = std::vector<index>(size);

    for (int i = 0; i < size; ++i) {
        indices[i].read(stream);
    }
}